

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceMatrixDecomposition::buildNeighborList
          (ForceMatrixDecomposition *this,vector<int,_std::allocator<int>_> *neighborList,
          vector<int,_std::allocator<int>_> *point,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *savedPositions
          )

{
  vector<int,std::allocator<int>> *this_00;
  double dVar1;
  int iVar2;
  pointer pVVar3;
  undefined8 uVar4;
  iterator iVar5;
  pointer pvVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_01;
  uint i;
  long lVar14;
  double *pdVar15;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  Snapshot *pSVar20;
  int iVar21;
  int j_4;
  pointer piVar22;
  int j_2;
  pointer pVVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  double tmp;
  double dVar27;
  int iVar29;
  undefined1 auVar28 [16];
  int iVar30;
  double tmp_4;
  double dVar31;
  int iVar32;
  double tmp_5;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  Vector<int,_3U> result_1;
  Vector3i whichCell;
  Vector3d scaled;
  Vector3d rs;
  Vector<double,_3U> v_2;
  Vector<double,_3U> v_1;
  Vector<double,_3U> v;
  Vector3d dr;
  Mat3x3d box;
  Mat3x3d invBox;
  uint local_274;
  Snapshot *local_270;
  undefined8 local_268;
  double dStack_260;
  double local_258;
  int local_248 [4];
  double local_238 [4];
  double local_218 [3];
  vector<int,_std::allocator<int>_> *local_200;
  double local_1f8 [4];
  double local_1d8 [4];
  double local_1b8 [4];
  Vector3d local_198;
  double local_178;
  undefined8 uStack_170;
  vector<int,std::allocator<int>> *local_168;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_160;
  double local_158 [4];
  double local_138 [3];
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_120;
  Mat3x3d local_118;
  double local_c8 [10];
  undefined8 local_78 [9];
  
  piVar22 = (neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar22) {
    (neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar22;
  }
  piVar22 = (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if ((point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar22) {
    (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar22;
  }
  pSVar20 = ((this->super_ForceDecomposition).sman_)->currentSnapshot_;
  local_c8[8] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_78[8] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_218[2] = 0.0;
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  local_238[2] = 0.0;
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_198.super_Vector<double,_3U>.data_[2] = 0.0;
  local_198.super_Vector<double,_3U>.data_[0] = 0.0;
  local_198.super_Vector<double,_3U>.data_[1] = 0.0;
  local_248[0] = 0;
  local_248[1] = 0;
  local_248[2] = 0;
  local_160 = &(this->super_ForceDecomposition).cellList_;
  local_168 = (vector<int,std::allocator<int>> *)neighborList;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(local_160,
                    (this->super_ForceDecomposition).cellList_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<int,_std::allocator<int>_>::resize(point,(long)this->nGroups_ + 1);
  local_270 = pSVar20;
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == false) {
    Snapshot::getBoundingBox(&local_118,pSVar20);
    lVar14 = 0;
    do {
      *(undefined8 *)((long)local_c8 + lVar14 + 0x10) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14 + 0x10);
      uVar4 = *(undefined8 *)
               ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar14 + 8);
      *(undefined8 *)((long)local_c8 + lVar14) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14);
      *(undefined8 *)((long)local_c8 + lVar14 + 8) = uVar4;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
    Snapshot::getInvBoundingBox(&local_118,local_270);
    lVar14 = 0;
    do {
      *(undefined8 *)((long)local_78 + lVar14 + 0x10) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14 + 0x10);
      uVar4 = *(undefined8 *)
               ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar14 + 8);
      *(undefined8 *)((long)local_78 + lVar14) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14);
      *(undefined8 *)((long)local_78 + lVar14 + 8) = uVar4;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
  }
  else {
    Snapshot::getHmat(&local_118,pSVar20);
    lVar14 = 0;
    do {
      *(undefined8 *)((long)local_c8 + lVar14 + 0x10) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14 + 0x10);
      uVar4 = *(undefined8 *)
               ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar14 + 8);
      *(undefined8 *)((long)local_c8 + lVar14) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14);
      *(undefined8 *)((long)local_c8 + lVar14 + 8) = uVar4;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
    Snapshot::getInvHmat(&local_118,local_270);
    lVar14 = 0;
    do {
      *(undefined8 *)((long)local_78 + lVar14 + 0x10) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14 + 0x10);
      uVar4 = *(undefined8 *)
               ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar14 + 8);
      *(undefined8 *)((long)local_78 + lVar14) =
           *(undefined8 *)
            ((long)local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar14);
      *(undefined8 *)((long)local_78 + lVar14 + 8) = uVar4;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
  }
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_1b8[2] = 0.0;
  pdVar15 = local_c8;
  lVar14 = 0;
  do {
    local_1b8[lVar14] = *pdVar15;
    dVar1 = local_1b8[2];
    dVar31 = local_1b8[1];
    dVar27 = local_1b8[0];
    lVar14 = lVar14 + 1;
    pdVar15 = pdVar15 + 3;
  } while (lVar14 != 3);
  local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
       local_1b8[2];
  local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       local_1b8[0];
  local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       local_1b8[1];
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 0.0;
  pdVar15 = local_c8 + 1;
  lVar14 = 0;
  do {
    local_1d8[lVar14] = *pdVar15;
    dVar13 = local_1d8[2];
    dVar12 = local_1d8[1];
    dVar11 = local_1d8[0];
    lVar14 = lVar14 + 1;
    pdVar15 = pdVar15 + 3;
  } while (lVar14 != 3);
  local_1b8[2] = local_1d8[2];
  local_1b8[0] = local_1d8[0];
  local_1b8[1] = local_1d8[1];
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1f8[2] = 0.0;
  pdVar15 = local_c8 + 2;
  lVar14 = 0;
  do {
    local_1f8[lVar14] = *pdVar15;
    dVar10 = local_1f8[2];
    dVar9 = local_1f8[1];
    lVar14 = lVar14 + 1;
    pdVar15 = pdVar15 + 3;
  } while (lVar14 != 3);
  local_1d8[2] = local_1f8[2];
  local_1d8[0] = local_1f8[0];
  local_1d8[1] = local_1f8[1];
  dVar38 = local_1f8[0] * dVar12;
  dVar33 = dVar12 * local_1f8[2];
  dVar34 = dVar13 * local_1f8[0];
  dVar36 = local_1f8[2] * dVar31;
  dVar37 = local_1f8[0] * dVar1;
  dVar35 = local_1f8[0] * dVar31;
  local_1f8[0] = dVar31 * dVar13 - dVar12 * dVar1;
  local_1f8[1] = dVar1 * dVar11 - dVar13 * dVar27;
  local_1f8[2] = dVar27 * dVar12 - dVar11 * dVar31;
  local_138[0] = dVar33 - dVar13 * dVar9;
  local_138[1] = dVar34 - dVar11 * dVar10;
  local_138[2] = dVar11 * dVar9 - dVar38;
  local_158[0] = dVar1 * dVar9 - dVar36;
  local_158[1] = dVar27 * dVar10 - dVar37;
  local_158[2] = dVar35 - dVar27 * dVar9;
  dVar27 = 0.0;
  lVar14 = 0;
  do {
    dVar27 = dVar27 + local_1f8[lVar14] * local_1f8[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  if (dVar27 < 0.0) {
    dVar27 = sqrt(dVar27);
  }
  else {
    dVar27 = SQRT(dVar27);
  }
  lVar14 = 0;
  do {
    local_1f8[lVar14] = local_1f8[lVar14] / dVar27;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  dVar27 = 0.0;
  lVar14 = 0;
  do {
    dVar27 = dVar27 + local_138[lVar14] * local_138[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  if (dVar27 < 0.0) {
    dVar27 = sqrt(dVar27);
  }
  else {
    dVar27 = SQRT(dVar27);
  }
  lVar14 = 0;
  do {
    local_138[lVar14] = local_138[lVar14] / dVar27;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  dVar27 = 0.0;
  lVar14 = 0;
  do {
    dVar27 = dVar27 + local_158[lVar14] * local_158[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  if (dVar27 < 0.0) {
    dVar27 = sqrt(dVar27);
  }
  else {
    dVar27 = SQRT(dVar27);
  }
  lVar14 = 0;
  do {
    local_158[lVar14] = local_158[lVar14] / dVar27;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  dVar27 = 0.0;
  lVar14 = 0;
  do {
    dVar27 = dVar27 + local_118.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][lVar14] * local_138[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  dVar31 = 0.0;
  lVar14 = 0;
  do {
    dVar31 = dVar31 + local_1b8[lVar14] * local_158[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  auVar28._0_8_ = ABS(dVar27);
  dVar27 = 0.0;
  lVar14 = 0;
  do {
    dVar27 = dVar27 + local_1d8[lVar14] * local_1f8[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  dVar1 = (this->super_ForceDecomposition).rList_;
  auVar28._8_8_ = ABS(dVar31);
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  auVar28 = divpd(auVar28,auVar7);
  iVar26 = (int)auVar28._0_8_;
  iVar29 = (int)auVar28._8_8_;
  *(ulong *)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_ =
       CONCAT44(iVar29,iVar26);
  iVar24 = (int)(ABS(dVar27) / dVar1);
  (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[2] = iVar24;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(local_160,(long)(iVar26 * iVar29 * iVar24));
  local_120 = savedPositions;
  if (((iVar24 < 3) || (iVar29 < 3)) || (iVar26 < 3)) {
    if (0 < this->nGroups_) {
      uVar25 = 0;
      iVar24 = 0;
      pSVar20 = local_270;
      do {
        (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar25] = iVar24;
        pVVar3 = (pSVar20->cgData).position.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_218[2] = *(double *)((long)pVVar3[uVar25].super_Vector<double,_3U>.data_ + 0x10);
        pVVar3 = pVVar3 + uVar25;
        local_218[0] = (pVVar3->super_Vector<double,_3U>).data_[0];
        local_218[1] = *(double *)((long)(pVVar3->super_Vector<double,_3U>).data_ + 8);
        local_274 = (uint)uVar25;
        if ((long)uVar25 < (long)this->nGroups_) {
          uVar17 = uVar25 & 0xffffffff;
          do {
            pVVar3 = (pSVar20->cgData).position.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_268 = 0.0;
            dStack_260 = 0.0;
            local_258 = 0.0;
            lVar14 = 0;
            do {
              (&local_268)[lVar14] =
                   *(double *)
                    ((long)pVVar3[(int)uVar17].super_Vector<double,_3U>.data_ + lVar14 * 8) -
                   local_218[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            local_198.super_Vector<double,_3U>.data_[2] = local_258;
            local_198.super_Vector<double,_3U>.data_[0] = local_268;
            local_198.super_Vector<double,_3U>.data_[1] = dStack_260;
            if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
              Snapshot::wrapVector(local_270,&local_198);
              pSVar20 = local_270;
            }
            dVar27 = 0.0;
            lVar14 = 0;
            do {
              dVar31 = local_198.super_Vector<double,_3U>.data_[lVar14];
              dVar27 = dVar27 + dVar31 * dVar31;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            if (dVar27 < (this->super_ForceDecomposition).rListSq_) {
              iVar5._M_current = *(int **)(local_168 + 8);
              if (iVar5._M_current == *(int **)(local_168 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_168,iVar5,(int *)&local_274);
                pSVar20 = local_270;
              }
              else {
                *iVar5._M_current = local_274;
                *(int **)(local_168 + 8) = iVar5._M_current + 1;
              }
              iVar24 = iVar24 + 1;
            }
            local_274 = local_274 + 1;
            uVar17 = (ulong)local_274;
          } while ((int)local_274 < this->nGroups_);
        }
        uVar25 = uVar25 + 1;
      } while ((long)uVar25 < (long)this->nGroups_);
      goto LAB_0017cf3d;
    }
  }
  else {
    local_274 = 0;
    iVar24 = local_248[0];
    local_200 = point;
    if (0 < this->nGroups_) {
      do {
        uVar8 = local_274;
        pVVar3 = (local_270->cgData).position.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_218[2] = *(double *)
                        ((long)pVVar3[(int)local_274].super_Vector<double,_3U>.data_ + 0x10);
        pVVar3 = pVVar3 + (int)local_274;
        local_218[0] = (pVVar3->super_Vector<double,_3U>).data_[0];
        local_218[1] = *(double *)((long)(pVVar3->super_Vector<double,_3U>).data_ + 8);
        local_268 = 0.0;
        dStack_260 = 0.0;
        local_258 = 0.0;
        lVar14 = 0;
        puVar16 = local_78;
        do {
          dVar27 = (double)(&local_268)[lVar14];
          lVar18 = 0;
          do {
            dVar27 = dVar27 + (double)puVar16[lVar18] * local_218[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          (&local_268)[lVar14] = dVar27;
          lVar14 = lVar14 + 1;
          puVar16 = puVar16 + 3;
        } while (lVar14 != 3);
        local_238[2] = local_258;
        local_238[0] = local_268;
        local_238[1] = dStack_260;
        lVar14 = 0;
        do {
          local_178 = local_238[lVar14];
          uStack_170 = 0;
          if (0.0 <= local_178) {
            dVar27 = floor(local_178 + 0.5);
          }
          else {
            dVar27 = ceil(local_178 + -0.5);
          }
          dVar27 = (local_178 - dVar27) + 0.5;
          local_238[lVar14] =
               (double)(~-(ulong)(dVar27 < 1.0) & (ulong)(dVar27 + -1.0) |
                       (ulong)dVar27 & -(ulong)(dVar27 < 1.0));
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        iVar26 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[0];
        iVar24 = (int)((double)iVar26 * local_238[0]);
        uVar4 = *(undefined8 *)
                 ((this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_ + 1);
        iVar29 = (int)uVar4;
        iVar30 = (int)(local_238[1] * (double)iVar29);
        iVar32 = (int)(local_238[2] * (double)(int)((ulong)uVar4 >> 0x20));
        dVar27 = (double)CONCAT44(iVar32,iVar30);
        this_00 = (vector<int,std::allocator<int>> *)
                  ((this->super_ForceDecomposition).cellList_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                  ((iVar29 * iVar32 + iVar30) * iVar26 + iVar24));
        iVar5._M_current = *(int **)(this_00 + 8);
        if (iVar5._M_current == *(int **)(this_00 + 0x10)) {
          uStack_170 = 0;
          local_178 = dVar27;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,iVar5,(int *)&local_274);
          dVar27 = local_178;
        }
        else {
          *iVar5._M_current = uVar8;
          *(int **)(this_00 + 8) = iVar5._M_current + 1;
        }
        local_274 = local_274 + 1;
      } while ((int)local_274 < this->nGroups_);
      local_248[1] = SUB84(dVar27,0);
      local_248[2] = (int)((ulong)dVar27 >> 0x20);
    }
    local_248[0] = iVar24;
    point = local_200;
    if (0 < this->nGroups_) {
      lVar14 = 0;
      iVar24 = 0;
      pSVar20 = local_270;
      do {
        pVVar3 = (pSVar20->cgData).position.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_218[2] = *(double *)((long)pVVar3[lVar14].super_Vector<double,_3U>.data_ + 0x10);
        pVVar3 = pVVar3 + lVar14;
        local_218[0] = (pVVar3->super_Vector<double,_3U>).data_[0];
        local_218[1] = *(double *)((long)(pVVar3->super_Vector<double,_3U>).data_ + 8);
        (local_200->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar14] = iVar24;
        local_268 = 0.0;
        dStack_260 = 0.0;
        local_258 = 0.0;
        puVar16 = local_78;
        lVar18 = 0;
        do {
          dVar27 = (double)(&local_268)[lVar18];
          lVar19 = 0;
          do {
            dVar27 = dVar27 + (double)puVar16[lVar19] * local_218[lVar19];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          (&local_268)[lVar18] = dVar27;
          lVar18 = lVar18 + 1;
          puVar16 = puVar16 + 3;
        } while (lVar18 != 3);
        local_238[2] = local_258;
        local_238[0] = local_268;
        local_238[1] = dStack_260;
        lVar18 = 0;
        do {
          local_178 = local_238[lVar18];
          uStack_170 = 0;
          if (0.0 <= local_178) {
            dVar27 = floor(local_178 + 0.5);
          }
          else {
            dVar27 = ceil(local_178 + -0.5);
          }
          dVar27 = (local_178 - dVar27) + 0.5;
          local_238[lVar18] =
               (double)(~-(ulong)(dVar27 < 1.0) & (ulong)(dVar27 + -1.0) |
                       (ulong)dVar27 & -(ulong)(dVar27 < 1.0));
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        uVar4 = *(undefined8 *)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_;
        local_248[0] = (int)((double)(int)uVar4 * local_238[0]);
        local_248[1] = (int)((double)(int)((ulong)uVar4 >> 0x20) * local_238[1]);
        local_248[2] = (int)((double)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.
                                     data_[2] * local_238[2]);
        pSVar20 = local_270;
        for (pVVar23 = (this->super_ForceDecomposition).cellOffsets_.
                       super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pVVar23 !=
            (this->super_ForceDecomposition).cellOffsets_.
            super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl
            .super__Vector_impl_data._M_finish; pVVar23 = pVVar23 + 1) {
          dStack_260 = (double)((ulong)dStack_260 & 0xffffffff00000000);
          local_268 = 0.0;
          lVar18 = 0;
          do {
            *(int *)((long)&local_268 + lVar18 * 4) =
                 (pVVar23->super_Vector<int,_3U>).data_[lVar18] + local_248[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          iVar26 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[0];
          iVar29 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[1];
          iVar30 = iVar26 + -1;
          if (-1 < (int)local_268) {
            iVar30 = (int)local_268;
          }
          if (iVar26 <= (int)local_268) {
            iVar30 = 0;
          }
          iVar32 = iVar29 + -1;
          if (-1 < (long)local_268) {
            iVar32 = local_268._4_4_;
          }
          if (iVar29 <= local_268._4_4_) {
            iVar32 = 0;
          }
          iVar2 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[2];
          iVar21 = iVar2 + -1;
          if (-1 < dStack_260._0_4_) {
            iVar21 = dStack_260._0_4_;
          }
          if (iVar2 <= dStack_260._0_4_) {
            iVar21 = 0;
          }
          iVar30 = (iVar21 * iVar29 + iVar32) * iVar26 + iVar30;
          pvVar6 = (this->super_ForceDecomposition).cellList_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar22 = pvVar6[iVar30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pSVar20 = local_270;
          if (piVar22 !=
              *(pointer *)
               ((long)&pvVar6[iVar30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + 8)) {
            do {
              iVar26 = *piVar22;
              if (lVar14 <= iVar26) {
                pVVar3 = (pSVar20->cgData).position.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_268 = 0.0;
                dStack_260 = 0.0;
                local_258 = 0.0;
                lVar18 = 0;
                do {
                  (&local_268)[lVar18] =
                       *(double *)((long)pVVar3[iVar26].super_Vector<double,_3U>.data_ + lVar18 * 8)
                       - local_218[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                local_198.super_Vector<double,_3U>.data_[2] = local_258;
                local_198.super_Vector<double,_3U>.data_[0] = local_268;
                local_198.super_Vector<double,_3U>.data_[1] = dStack_260;
                if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
                  Snapshot::wrapVector(local_270,&local_198);
                  pSVar20 = local_270;
                }
                dVar27 = 0.0;
                lVar18 = 0;
                do {
                  dVar31 = local_198.super_Vector<double,_3U>.data_[lVar18];
                  dVar27 = dVar27 + dVar31 * dVar31;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                if (dVar27 < (this->super_ForceDecomposition).rListSq_) {
                  iVar5._M_current = *(int **)(local_168 + 8);
                  if (iVar5._M_current == *(int **)(local_168 + 0x10)) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_168,iVar5,piVar22);
                    pSVar20 = local_270;
                  }
                  else {
                    *iVar5._M_current = *piVar22;
                    *(int **)(local_168 + 8) = iVar5._M_current + 1;
                  }
                  iVar24 = iVar24 + 1;
                }
              }
              piVar22 = piVar22 + 1;
            } while (piVar22 !=
                     *(pointer *)
                      ((long)&(local_160->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[iVar30].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8));
          }
        }
        lVar14 = lVar14 + 1;
        point = local_200;
      } while (lVar14 < this->nGroups_);
      goto LAB_0017cf3d;
    }
  }
  iVar24 = 0;
LAB_0017cf3d:
  this_01 = local_120;
  (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [this->nGroups_] = iVar24;
  pVVar3 = (local_120->
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((local_120->
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar3) {
    (local_120->
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
            (local_120,(long)this->nGroups_);
  pSVar20 = local_270;
  if (0 < this->nGroups_) {
    lVar14 = 0;
    lVar18 = 0;
    do {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                (this_01,(value_type *)
                         ((long)(((pSVar20->cgData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_Vector<double,_3U>).data_ + lVar14));
      lVar18 = lVar18 + 1;
      lVar14 = lVar14 + 0x18;
    } while (lVar18 < this->nGroups_);
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::buildNeighborList(
      vector<int>& neighborList, vector<int>& point,
      vector<Vector3d>& savedPositions) {
    neighborList.clear();
    point.clear();
    int len = 0;

    bool doAllPairs = false;

    Snapshot* snap_ = sman_->getCurrentSnapshot();
    Mat3x3d box;
    Mat3x3d invBox;

    Vector3d rs, scaled, dr;
    Vector3i whichCell;
    int cellIndex;

#ifdef IS_MPI
    cellListRow_.clear();
    cellListCol_.clear();
    point.resize(nGroupsInRow_ + 1);
#else
    cellList_.clear();
    point.resize(nGroups_ + 1);
#endif

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nCells_.x() = int(Wa / rList_);
    nCells_.y() = int(Wb / rList_);
    nCells_.z() = int(Wc / rList_);

    // handle small boxes where the cell offsets can end up repeating cells
    if (nCells_.x() < 3) doAllPairs = true;
    if (nCells_.y() < 3) doAllPairs = true;
    if (nCells_.z() < 3) doAllPairs = true;

    int nCtot = nCells_.x() * nCells_.y() * nCells_.z();

#ifdef IS_MPI
    cellListRow_.resize(nCtot);
    cellListCol_.resize(nCtot);
#else
    cellList_.resize(nCtot);
#endif

    if (!doAllPairs) {
#ifdef IS_MPI

      for (int i = 0; i < nGroupsInRow_; i++) {
        rs = cgRowData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellListRow_[cellIndex].push_back(i);
      }
      for (int i = 0; i < nGroupsInCol_; i++) {
        rs = cgColData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellListCol_[cellIndex].push_back(i);
      }

#else
      for (int i = 0; i < nGroups_; i++) {
        rs = snap_->cgData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellList_[cellIndex].push_back(i);
      }

#endif

#ifdef IS_MPI
      for (int j1 = 0; j1 < nGroupsInRow_; j1++) {
        rs = cgRowData.position[j1];
#else

      for (int j1 = 0; j1 < nGroups_; j1++) {
        rs = snap_->cgData.position[j1];
#endif
        point[j1] = len;

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        for (vector<Vector3i>::iterator os = cellOffsets_.begin();
             os != cellOffsets_.end(); ++os) {
          Vector3i m2v = whichCell + (*os);

          if (m2v.x() >= nCells_.x()) {
            m2v.x() = 0;
          } else if (m2v.x() < 0) {
            m2v.x() = nCells_.x() - 1;
          }

          if (m2v.y() >= nCells_.y()) {
            m2v.y() = 0;
          } else if (m2v.y() < 0) {
            m2v.y() = nCells_.y() - 1;
          }

          if (m2v.z() >= nCells_.z()) {
            m2v.z() = 0;
          } else if (m2v.z() < 0) {
            m2v.z() = nCells_.z() - 1;
          }
          int m2 = Vlinear(m2v, nCells_);
#ifdef IS_MPI
          for (vector<int>::iterator j2 = cellListCol_[m2].begin();
               j2 != cellListCol_[m2].end(); ++j2) {
            // In parallel, we need to visit *all* pairs of row
            // & column indicies and will divide labor in the
            // force evaluation later.
            dr = cgColData.position[(*j2)] - rs;
            if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
            if (dr.lengthSquare() < rListSq_) {
              neighborList.push_back((*j2));
              ++len;
            }
          }
#else
          for (vector<int>::iterator j2 = cellList_[m2].begin();
               j2 != cellList_[m2].end(); ++j2) {
            // Always do this if we're in different cells or if
            // we're in the same cell and the global index of
            // the j2 cutoff group is greater than or equal to
            // the j1 cutoff group.  Note that Rappaport's code
            // has a "less than" conditional here, but that
            // deals with atom-by-atom computation.  OpenMD
            // allows atoms within a single cutoff group to
            // interact with each other.

            if ((*j2) >= j1) {
              dr = snap_->cgData.position[(*j2)] - rs;
              if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
              if (dr.lengthSquare() < rListSq_) {
                neighborList.push_back((*j2));
                ++len;
              }
            }
          }
#endif
        }
      }
    } else {
      // branch to do all cutoff group pairs
#ifdef IS_MPI
      for (int j1 = 0; j1 < nGroupsInRow_; j1++) {
        point[j1] = len;
        rs        = cgRowData.position[j1];
        for (int j2 = 0; j2 < nGroupsInCol_; j2++) {
          dr = cgColData.position[j2] - rs;
          if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
          if (dr.lengthSquare() < rListSq_) {
            neighborList.push_back(j2);
            ++len;
          }
        }
      }
#else
      // include all groups here.
      for (int j1 = 0; j1 < nGroups_; j1++) {
        point[j1] = len;
        rs        = snap_->cgData.position[j1];
        // include self group interactions j2 == j1
        for (int j2 = j1; j2 < nGroups_; j2++) {
          dr = snap_->cgData.position[j2] - rs;
          if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
          if (dr.lengthSquare() < rListSq_) {
            neighborList.push_back(j2);
            ++len;
          }
        }
      }
#endif
    }

#ifdef IS_MPI
    point[nGroupsInRow_] = len;
#else
    point[nGroups_] = len;
#endif

    // save the local cutoff group positions for the check that is
    // done on each loop:
    savedPositions.clear();
    savedPositions.reserve(nGroups_);
    for (int i = 0; i < nGroups_; i++)
      savedPositions.push_back(snap_->cgData.position[i]);
  }